

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

void pnga_access_ghosts(Integer g_a,Integer *dims,AccessIndex *index,Integer *ld)

{
  Integer IVar1;
  ulong uVar2;
  long *in_RDX;
  long in_RDI;
  unsigned_long lptr;
  unsigned_long lref;
  unsigned_long elemsize;
  Integer handle;
  char *ptr;
  Integer in_stack_00000138;
  char *in_stack_00000140;
  Integer *in_stack_000001c8;
  void *in_stack_000001d0;
  Integer *in_stack_000001d8;
  Integer in_stack_000001e0;
  DoubleComplex *local_40;
  
  local_40 = (DoubleComplex *)0x0;
  pnga_access_ghost_ptr(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8);
  uVar2 = (ulong)GA[in_RDI + 1000].elemsize;
  IVar1 = pnga_type_c2f((long)GA[in_RDI + 1000].type);
  switch(IVar1) {
  case 0x3f2:
    *in_RDX = -(long)INT_MB >> 3;
    local_40 = (DoubleComplex *)INT_MB;
    break;
  case 0x3f4:
    *in_RDX = -(long)FLT_MB >> 2;
    local_40 = (DoubleComplex *)FLT_MB;
    break;
  case 0x3f5:
    *in_RDX = -(long)DBL_MB >> 3;
    local_40 = (DoubleComplex *)DBL_MB;
    break;
  case 0x3f6:
    *in_RDX = -(long)SCPL_MB >> 3;
    local_40 = (DoubleComplex *)SCPL_MB;
    break;
  case 0x3f7:
    *in_RDX = -(long)DCPL_MB >> 4;
    local_40 = DCPL_MB;
  }
  if (0U % uVar2 != (ulong)local_40 % uVar2) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",GAme & 0xffffffff,0,0 % uVar2,local_40,
           (ulong)local_40 % uVar2);
    pnga_error(in_stack_00000140,in_stack_00000138);
  }
  *in_RDX = *in_RDX + 1;
  return;
}

Assistant:

void pnga_access_ghosts(Integer g_a, Integer dims[],
                      AccessIndex* index, Integer ld[])
{
char     *ptr=NULL;
Integer  handle = GA_OFFSET + g_a;
unsigned long    elemsize=0;
unsigned long    lref=0, lptr=0;

   pnga_access_ghost_ptr(g_a, dims, &ptr, ld);

   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        

   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}